

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_input_mouse_clicked(nk_input *i,nk_buttons id,nk_rect rect)

{
  nk_rect rect_00;
  nk_rect b;
  nk_input *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  float unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffffc;
  nk_bool nVar2;
  
  uVar1 = (undefined4)in_XMM0_Qa;
  if (in_RDI == (nk_input *)0x0) {
    nVar2 = 0;
  }
  else {
    rect_00._8_8_ = in_XMM1_Qa;
    rect_00._0_8_ = in_XMM0_Qa;
    nVar2 = nk_input_is_mouse_hovering_rect(in_RDI,rect_00);
    if (nVar2 == 0) {
      nVar2 = 0;
    }
    else {
      b.w = (float)in_stack_fffffffffffffffc;
      b.x = (float)(int)in_XMM1_Qa;
      b.y = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
      b.h = unaff_retaddr;
      nVar2 = nk_input_is_mouse_click_in_rect
                        ((nk_input *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),
                         (nk_buttons)((ulong)in_RDI >> 0x20),b);
    }
  }
  return nVar2;
}

Assistant:

NK_API nk_bool
nk_input_mouse_clicked(const struct nk_input *i, enum nk_buttons id, struct nk_rect rect)
{
if (!i) return nk_false;
if (!nk_input_is_mouse_hovering_rect(i, rect)) return nk_false;
return nk_input_is_mouse_click_in_rect(i, id, rect);
}